

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Cues::LoadCuePoint(Cues *this)

{
  IMkvReader *pReader;
  CuePoint *this_00;
  bool bVar1;
  longlong lVar2;
  longlong lVar3;
  long lVar4;
  long lVar5;
  long len;
  long local_40;
  longlong local_38;
  
  lVar5 = this->m_size + this->m_start;
  if (lVar5 <= this->m_pos) {
    return false;
  }
  bVar1 = Init(this);
  if (bVar1) {
    lVar4 = this->m_pos;
    if (lVar5 <= lVar4) {
      return false;
    }
    pReader = this->m_pSegment->m_pReader;
    while( true ) {
      local_38 = lVar4;
      lVar2 = ReadID(pReader,lVar4,&local_40);
      if (lVar2 < 0) {
        return false;
      }
      lVar4 = local_40 + this->m_pos;
      if (lVar5 < lVar4) {
        return false;
      }
      this->m_pos = lVar4;
      lVar3 = ReadUInt(pReader,lVar4,&local_40);
      if (lVar3 < 0) {
        return false;
      }
      lVar4 = local_40 + this->m_pos;
      if (lVar5 < lVar4) {
        return false;
      }
      this->m_pos = lVar4;
      lVar4 = lVar4 + lVar3;
      if (lVar5 < lVar4) {
        return false;
      }
      if (lVar2 == 0xbb) break;
      this->m_pos = lVar4;
      if (lVar5 <= lVar4) {
        return false;
      }
    }
    if (this->m_preload_count < 1) {
      return false;
    }
    this_00 = this->m_cue_points[this->m_count];
    if (this_00 == (CuePoint *)0x0) {
      return false;
    }
    if ((this_00->m_timecode < 0) && (local_38 != -this_00->m_timecode)) {
      return false;
    }
    bVar1 = CuePoint::Load(this_00,pReader);
    if (bVar1) {
      this->m_count = this->m_count + 1;
      this->m_preload_count = this->m_preload_count + -1;
      lVar4 = lVar3 + this->m_pos;
      this->m_pos = lVar4;
      return lVar4 <= lVar5;
    }
  }
  this->m_pos = lVar5;
  return false;
}

Assistant:

bool Cues::LoadCuePoint() const {
  const long long stop = m_start + m_size;

  if (m_pos >= stop)
    return false;  // nothing else to do

  if (!Init()) {
    m_pos = stop;
    return false;
  }

  IMkvReader* const pReader = m_pSegment->m_pReader;

  while (m_pos < stop) {
    const long long idpos = m_pos;

    long len;

    const long long id = ReadID(pReader, m_pos, len);
    if (id < 0 || (m_pos + len) > stop)
      return false;

    m_pos += len;  // consume ID

    const long long size = ReadUInt(pReader, m_pos, len);
    if (size < 0 || (m_pos + len) > stop)
      return false;

    m_pos += len;  // consume Size field
    if ((m_pos + size) > stop)
      return false;

    if (id != libwebm::kMkvCuePoint) {
      m_pos += size;  // consume payload
      if (m_pos > stop)
        return false;

      continue;
    }

    if (m_preload_count < 1)
      return false;

    CuePoint* const pCP = m_cue_points[m_count];
    if (!pCP || (pCP->GetTimeCode() < 0 && (-pCP->GetTimeCode() != idpos)))
      return false;

    if (!pCP->Load(pReader)) {
      m_pos = stop;
      return false;
    }
    ++m_count;
    --m_preload_count;

    m_pos += size;  // consume payload
    if (m_pos > stop)
      return false;

    return true;  // yes, we loaded a cue point
  }

  return false;  // no, we did not load a cue point
}